

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

void __thiscall asl::String::split(String *this,String *sep,Array<asl::String> *out)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  anon_union_16_2_78e7fdac_for_String_2 *__needle;
  uint j;
  int i;
  anon_union_16_2_78e7fdac_for_String_2 *paVar5;
  String local_48;
  
  i = 0;
  Array<asl::String>::resize(out,0);
  uVar1 = this->_len;
  if (-1 < (int)uVar1) {
    iVar2 = sep->_len;
    do {
      __needle = &sep->field_2;
      if (sep->_size != 0) {
        __needle = (anon_union_16_2_78e7fdac_for_String_2 *)(sep->field_2)._str;
      }
      paVar5 = &this->field_2;
      if (this->_size != 0) {
        paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
      }
      pcVar4 = strstr(paVar5->_space + i,__needle->_space);
      uVar3 = -(uint)(pcVar4 == (char *)0x0) | (int)pcVar4 - (int)paVar5;
      j = uVar1;
      if (uVar3 != 0xffffffff) {
        j = uVar3;
      }
      substring(&local_48,this,i,j);
      Array<asl::String>::insert(out,-1,&local_48);
      if (local_48._size != 0) {
        ::free(local_48.field_2._str);
      }
      i = j + iVar2;
    } while (i <= (int)uVar1);
  }
  return;
}

Assistant:

void String::split(const String& sep, Array<String>& out) const
{
	out.clear();
	int j=0, m=sep.length(), n=length();
	for(int i=0; i<=n; i=j+m)
	{
		j=indexOf(sep, i);
		if(j==-1) j=n;
		out << substring(i, j);
	}
}